

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void multi_process_server(int port,string *ip,string *log_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int sockfd;
  __pid_t _Var4;
  long *plVar5;
  size_type *psVar6;
  int iVar7;
  char *__end;
  client_socket client;
  Log log;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  client_socket local_b0;
  string local_80;
  Log local_60;
  
  Log::Log(&local_60,log_file);
  sockfd = C_std::Network::Socket(2,1,0);
  pcVar3 = (ip->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar3,pcVar3 + ip->_M_string_length);
  C_std::Network::easy_bind(sockfd,port,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  C_std::Network::Listen(sockfd,0x80);
  signal(0x11,wait_child);
  iVar7 = 0;
  do {
    C_std::Network::easy_accept(&local_b0,sockfd);
    _Var4 = fork();
    if (_Var4 < 0) {
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"fork error","");
      perror_exit(&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (_Var4 == 0) {
        C_std::Close(sockfd);
        std::__cxx11::to_string(&local_110,iVar7 + 1);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        paVar1 = &local_130.field_2;
        local_130._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_130._M_dataplus._M_p == psVar6) {
          local_130.field_2._M_allocated_capacity = *psVar6;
          local_130.field_2._8_8_ = plVar5[3];
          local_130._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar6;
        }
        local_130._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::operator+(&local_d0,&local_130,&local_b0.ip);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
        paVar2 = &local_150.field_2;
        local_150._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_150._M_dataplus._M_p == psVar6) {
          local_150.field_2._M_allocated_capacity = *psVar6;
          local_150.field_2._8_8_ = plVar5[3];
          local_150._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar6;
        }
        local_150._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::to_string(&local_f0,local_b0.port);
        std::operator+(&local_170,&local_150,&local_f0);
        Log::print(&local_60,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != paVar2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar1) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        server_func(&local_b0);
        std::__cxx11::to_string(&local_110,iVar7 + 1);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_130._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_130._M_dataplus._M_p == psVar6) {
          local_130.field_2._M_allocated_capacity = *psVar6;
          local_130.field_2._8_8_ = plVar5[3];
          local_130._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar6;
        }
        local_130._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::operator+(&local_d0,&local_130,&local_b0.ip);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_150._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_150._M_dataplus._M_p == psVar6) {
          local_150.field_2._M_allocated_capacity = *psVar6;
          local_150.field_2._8_8_ = plVar5[3];
          local_150._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar6;
        }
        local_150._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::to_string(&local_f0,local_b0.port);
        std::operator+(&local_170,&local_150,&local_f0);
        Log::print(&local_60,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        exit(1);
      }
      C_std::Close(local_b0.sockfd);
      iVar7 = iVar7 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.ip._M_dataplus._M_p != &local_b0.ip.field_2) {
      operator_delete(local_b0.ip._M_dataplus._M_p,local_b0.ip.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

void multi_process_server(int port, const std::string &ip, const std::string &log_file) {
    int client_num = 0;
    Log log(log_file);
    int listened_sockfd = Socket(AF_INET, SOCK_STREAM, 0);
    easy_bind(listened_sockfd, port, ip);
    Listen(listened_sockfd, 128);

    catch_signal();

    while(1) {
        client_socket client(easy_accept(listened_sockfd));
        pid_t pid = fork();
        if (pid < 0) {
            perror_exit("fork error");
        } else if (pid == 0) {
            //子进程逻辑
            Close(listened_sockfd);
            log.print(std::to_string(client_num + 1) + "th client connected : " + client.ip + " : " + std::to_string(client.port));
            server_func(client);
            log.print(std::to_string(client_num + 1) + "th client disconnect: " + client.ip + " : " + std::to_string(client.port));
            exit(1);
        } else {
            //父进程逻辑
            Close(client.sockfd);
            ++client_num;
        }
    }
}